

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Export.cpp
# Opt level: O0

string * validateName(string *__return_storage_ptr__,string *str)

{
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  char local_54;
  char cStack_53;
  char cStack_52;
  undefined1 uStack_51;
  undefined1 local_50;
  char buf [5];
  char *c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *str_local;
  string *out;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  c = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&c), bVar1) {
    pbVar3 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end1);
    iVar2 = isalnum((int)(char)*pbVar3);
    if ((iVar2 == 0) && (*pbVar3 != 0x5f)) {
      if (*pbVar3 == 0x2e) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'_');
      }
      else {
        local_50 = 0;
        _local_54 = CONCAT13(0x5f,CONCAT12("0123456789ABCDEF"[*pbVar3 & 0xf],
                                           CONCAT11("0123456789ABCDEF"[*pbVar3 >> 4],0x5f)));
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,&local_54);
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pbVar3);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string validateName(const std::string &str) {
	std::string out;
	for (const auto &c: str) {
		if (isalnum(c) || c == '_') {
			out += c;
		} else if(c == '.') {
			out += '_';
		} else {
			char buf[5] = "_xx_";
			buf[1] = ((c>>4)&0xf)["0123456789ABCDEF"];
			buf[2] = (c&0xf)["0123456789ABCDEF"];
			out += buf;
		}
	}

	return out;
}